

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

char * compile(char *filename)

{
  FILE *__stream;
  FILE *__stream_00;
  int *piVar1;
  char *pcVar2;
  char *preprocessed;
  FILE *file;
  char *filename_local;
  
  __stream_00 = fopen(filename,"r");
  __stream = _stderr;
  if (__stream_00 == (FILE *)0x0) {
    piVar1 = __errno_location();
    pcVar2 = strerror(*piVar1);
    fprintf(__stream,"Error: could not open file `%s`: %s\n",filename,pcVar2);
    exit(1);
  }
  pcVar2 = cpp((FILE *)__stream_00);
  printf("%s",pcVar2);
  fclose(__stream_00);
  yyin = (FILE *)fopen(filename,"r");
  yyparse();
  return filename;
}

Assistant:

char* compile(char *filename) {
    FILE *file = fopen(filename, "r");
    if(!file) { fprintf(stderr, "Error: could not open file `%s`: %s\n", filename, strerror(errno)); exit(1); }

    char *preprocessed = cpp(file);

    printf("%s", preprocessed);

    fclose(file);
    file = fopen(filename, "r");
    yyin=file;
    yyparse();
    return filename; // Haven't finished processing
}